

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_compilation.cpp
# Opt level: O2

error_code __thiscall pstore::exchange::import_ns::compilation::key(compilation *this,string *k)

{
  not_null<const_pstore::exchange::import_ns::string_mapping_*> args_1;
  bool bVar1;
  error_code eVar2;
  __shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  bVar1 = std::operator==(k,"triple");
  if (bVar1) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 1;
    eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                      (&this->super_rule,&this->triple_);
    return eVar2;
  }
  bVar1 = std::operator==(k,"definitions");
  if (bVar1) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 2;
    args_1.ptr_ = (this->names_).ptr_;
    std::
    __shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_30,
                   &(this->fragments_).
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    eVar2 = push_array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
                      (&this->super_rule,&this->definitions_,args_1,
                       (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                        *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    eVar2._4_4_ = 0;
    return eVar2;
  }
  eVar2 = make_error_code(unknown_compilation_object_key);
  return eVar2;
}

Assistant:

std::error_code compilation::key (std::string const & k) {
                if (k == "triple") {
                    seen_[triple_index] = true;
                    return push<uint64_rule> (&triple_);
                }
                if (k == "definitions") {
                    seen_[definitions_index] = true;
                    return push_array_rule<definition_object> (this, &definitions_, names_,
                                                               fragments_);
                }
                return error::unknown_compilation_object_key;
            }